

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

ngx_int_t ngx_parse_addr(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  in_addr_t iVar1;
  sockaddr *psVar2;
  ngx_int_t nVar3;
  size_t size;
  sa_family_t sVar4;
  undefined8 uStack_48;
  in6_addr inaddr6;
  
  uStack_48 = 0;
  inaddr6.__in6_u._0_8_ = 0;
  iVar1 = ngx_inet_addr(text,len);
  if (iVar1 == 0xffffffff) {
    nVar3 = ngx_inet6_addr(text,len,(u_char *)&uStack_48);
    if (nVar3 != 0) {
      return -5;
    }
    size = 0x1c;
    sVar4 = 10;
  }
  else {
    size = 0x10;
    sVar4 = 2;
  }
  psVar2 = (sockaddr *)ngx_pcalloc(pool,size);
  addr->sockaddr = psVar2;
  if (psVar2 == (sockaddr *)0x0) {
    nVar3 = -1;
  }
  else {
    psVar2->sa_family = sVar4;
    addr->socklen = (socklen_t)size;
    if (iVar1 == 0xffffffff) {
      *(undefined8 *)(psVar2->sa_data + 6) = uStack_48;
      psVar2[1].sa_family = inaddr6.__in6_u._0_2_;
      psVar2[1].sa_data[0] = inaddr6.__in6_u._2_1_;
      psVar2[1].sa_data[1] = inaddr6.__in6_u._3_1_;
      psVar2[1].sa_data[2] = inaddr6.__in6_u._4_1_;
      psVar2[1].sa_data[3] = inaddr6.__in6_u._5_1_;
      psVar2[1].sa_data[4] = inaddr6.__in6_u._6_1_;
      psVar2[1].sa_data[5] = inaddr6.__in6_u._7_1_;
    }
    else {
      *(in_addr_t *)(psVar2->sa_data + 2) = iVar1;
    }
    nVar3 = 0;
  }
  return nVar3;
}

Assistant:

ngx_int_t
ngx_parse_addr(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text, size_t len)
{
    in_addr_t             inaddr;
    ngx_uint_t            family;
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct in6_addr       inaddr6;
    struct sockaddr_in6  *sin6;

    /*
     * prevent MSVC8 warning:
     *    potentially uninitialized local variable 'inaddr6' used
     */
    ngx_memzero(&inaddr6, sizeof(struct in6_addr));
#endif

    inaddr = ngx_inet_addr(text, len);

    if (inaddr != INADDR_NONE) {
        family = AF_INET;
        len = sizeof(struct sockaddr_in);

#if (NGX_HAVE_INET6)
    } else if (ngx_inet6_addr(text, len, inaddr6.s6_addr) == NGX_OK) {
        family = AF_INET6;
        len = sizeof(struct sockaddr_in6);

#endif
    } else {
        return NGX_DECLINED;
    }

    addr->sockaddr = ngx_pcalloc(pool, len);
    if (addr->sockaddr == NULL) {
        return NGX_ERROR;
    }

    addr->sockaddr->sa_family = (u_char) family;
    addr->socklen = len;

    switch (family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) addr->sockaddr;
        ngx_memcpy(sin6->sin6_addr.s6_addr, inaddr6.s6_addr, 16);
        break;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) addr->sockaddr;
        sin->sin_addr.s_addr = inaddr;
        break;
    }

    return NGX_OK;
}